

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpClient.cpp
# Opt level: O0

void __thiscall
TcpClient::TcpClient(TcpClient *this,string *ip_address,uint port_number,io_service *ios)

{
  io_service *ios_local;
  uint port_number_local;
  string *ip_address_local;
  TcpClient *this_local;
  
  this->m_ios = ios;
  boost::asio::
  basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::basic_stream_socket<boost::asio::io_context>(&this->m_active_socket,this->m_ios,(type *)0x0);
  boost::asio::ip::address::from_string(&this->m_remote_ip,ip_address);
  boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::basic_endpoint
            (&this->m_remote_endpoint,&this->m_remote_ip,(unsigned_short)this->m_remote_port);
  this->m_remote_port = port_number;
  std::mutex::mutex(&this->m_socket_mutex);
  connectToServer(this);
  return;
}

Assistant:

TcpClient::TcpClient(std::string const & ip_address, unsigned int port_number, boost::asio::io_service & ios):
	m_ios(ios),
	m_remote_ip(boost::asio::ip::address::from_string(ip_address)),
	m_remote_port(port_number),
	m_remote_endpoint(m_remote_ip, m_remote_port),
	m_active_socket(m_ios)
{
	connectToServer();
}